

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

HeapType __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::pickSubEq
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  pointer *this_00;
  uint32_t uVar1;
  BasicHeapType BVar2;
  iterator __first;
  iterator __last;
  size_type sVar3;
  value_type *pvVar4;
  __normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
  local_70;
  const_iterator local_68;
  undefined1 local_50 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> arrayCandidates;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> candidates;
  uint32_t choice;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  uVar1 = Random::upTo(this->rand,0x10);
  switch(uVar1) {
  case 0:
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::eq,share);
    HeapType::HeapType((HeapType *)&this_local,BVar2);
    break;
  case 1:
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::array,share);
    HeapType::HeapType((HeapType *)&this_local,BVar2);
    break;
  case 2:
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::struct_,share);
    HeapType::HeapType((HeapType *)&this_local,BVar2);
    break;
  case 3:
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::none,share);
    HeapType::HeapType((HeapType *)&this_local,BVar2);
    break;
  default:
    getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this,share);
    getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50,this,share);
    this_00 = &arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_70._M_current =
         (HeapType *)
         std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                   ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)this_00);
    __gnu_cxx::
    __normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
    ::__normal_iterator<wasm::HeapType*>
              ((__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                *)&local_68,&local_70);
    __first = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50);
    __last = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50);
    std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
    insert<__gnu_cxx::__normal_iterator<wasm::HeapType*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>,void>
              ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)this_00,local_68,
               (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                )__first._M_current,
               (__normal_iterator<wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                )__last._M_current);
    sVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &arrayCandidates.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (sVar3 == 0) {
      switch(uVar1 >> 2) {
      case 0:
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::eq,share);
        HeapType::HeapType((HeapType *)&this_local,BVar2);
        break;
      case 1:
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::array,share);
        HeapType::HeapType((HeapType *)&this_local,BVar2);
        break;
      case 2:
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::struct_,share);
        HeapType::HeapType((HeapType *)&this_local,BVar2);
        break;
      case 3:
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::none,share);
        HeapType::HeapType((HeapType *)&this_local,BVar2);
        break;
      default:
        wasm::handle_unreachable
                  ("unexpected index",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                   ,0x181);
      }
    }
    else {
      pvVar4 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this->rand,
                          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &arrayCandidates.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local = (HeapTypeGeneratorImpl *)pvVar4->id;
    }
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_50);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &arrayCandidates.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (HeapType)(uintptr_t)this_local;
}

Assistant:

HeapType pickSubEq(Shareability share) {
    auto choice = rand.upTo(16);
    switch (choice) {
      case 0:
        return HeapTypes::eq.getBasic(share);
      case 1:
        return HeapTypes::array.getBasic(share);
      case 2:
        return HeapTypes::struct_.getBasic(share);
      case 3:
        return HeapTypes::none.getBasic(share);
      default: {
        auto candidates = getKindCandidates<StructKind>(share);
        auto arrayCandidates = getKindCandidates<ArrayKind>(share);
        candidates.insert(
          candidates.end(), arrayCandidates.begin(), arrayCandidates.end());
        if (candidates.size()) {
          return rand.pick(candidates);
        }
        switch (choice >> 2) {
          case 0:
            return HeapTypes::eq.getBasic(share);
          case 1:
            return HeapTypes::array.getBasic(share);
          case 2:
            return HeapTypes::struct_.getBasic(share);
          case 3:
            return HeapTypes::none.getBasic(share);
          default:
            WASM_UNREACHABLE("unexpected index");
        }
      }
    }
  }